

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O2

list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
imrt::Station::openBeamlet_abi_cxx11_
          (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
           *__return_storage_ptr__,Station *this,int beam,int aperture)

{
  int *piVar1;
  undefined8 uVar2;
  bool bVar3;
  pair<int,_int> pVar4;
  long lVar5;
  int *piVar6;
  int i;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  value_type local_58;
  _List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_48;
  
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node._M_size = 0;
  bVar3 = isActiveBeamlet(this,beam);
  if (bVar3) {
    bVar3 = isOpenBeamlet(this,beam,aperture);
    if (!bVar3) {
      pVar4 = Collimator::indexToPos(this->collimator,beam,this->angle);
      lVar9 = (long)pVar4.first;
      lVar5 = *(long *)&(this->A).
                        super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[aperture].
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data;
      uVar2 = *(undefined8 *)(lVar5 + lVar9 * 8);
      (this->last_mem).first.first = aperture;
      (this->last_mem).first.second = pVar4.first;
      (this->last_mem).second.first = (int)uVar2;
      (this->last_mem).second.second = (int)((ulong)uVar2 >> 0x20);
      iVar8 = *(int *)(lVar5 + lVar9 * 8);
      iVar10 = pVar4.second;
      if (iVar8 < 0) {
        local_58.second =
             (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[aperture];
        local_58.first = beam;
        std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
        push_back(__return_storage_ptr__,&local_58);
        piVar1 = (int *)(*(long *)&(this->A).
                                   super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[aperture].
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   ._M_impl.super__Vector_impl_data + lVar9 * 8);
        piVar6 = piVar1 + 1;
        *piVar1 = iVar10;
      }
      else if (iVar10 < iVar8) {
        for (iVar7 = 0; iVar7 < iVar8 - iVar10; iVar7 = iVar7 + 1) {
          local_58.first = beam + iVar7;
          local_58.second =
               (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[aperture];
          std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
          push_back(__return_storage_ptr__,&local_58);
          lVar5 = *(long *)&(this->A).
                            super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[aperture].
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data;
          iVar8 = *(int *)(lVar5 + lVar9 * 8);
        }
        piVar6 = (int *)(lVar5 + lVar9 * 8);
      }
      else {
        for (iVar8 = 0; iVar7 = *(int *)(lVar5 + 4 + lVar9 * 8), iVar8 < iVar10 - iVar7;
            iVar8 = iVar8 + 1) {
          local_58.first = iVar7 + (beam - iVar10) + 1 + iVar8;
          local_58.second =
               (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[aperture];
          std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
          push_back(__return_storage_ptr__,&local_58);
          lVar5 = *(long *)&(this->A).
                            super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[aperture].
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data;
        }
        piVar6 = (int *)(lVar5 + lVar9 * 8 + 4);
      }
      *piVar6 = iVar10;
      std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::list
                ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&local_48
                 ,__return_storage_ptr__);
      updateIntensity(this,(list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *
                           )&local_48);
      std::__cxx11::_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      _M_clear(&local_48);
    }
  }
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
            (&this->last_diff,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

list <pair<int,double> > Station::openBeamlet(int beam, int aperture) {
   // cout << "Attempt to open beam: " << beam << endl;
    list<pair<int, double>> diff;
    //cout << "active: " << isActiveBeamlet(beam) << " open: " << isOpenBeamlet(beam, aperture) << " aperture: " << aperture << endl;
    if (isActiveBeamlet(beam) && !isOpenBeamlet(beam, aperture)) {
      auto coord = collimator.indexToPos(beam, angle);
      int row= coord.first;
      //cout << "Coordinates: " << coord.first << "," << coord.second << endl;
      last_mem = make_pair(make_pair(aperture,row), A[aperture][row]);
      if (A[aperture][row].first < 0) {
        //When the row is completely closed
        diff.push_back(make_pair(beam, intensity[aperture]));
        A[aperture][row].first=coord.second;
        A[aperture][row].second=coord.second;
      } else {
        if (A[aperture][row].first > coord.second) {
          for (int i=0;i<(A[aperture][row].first-coord.second);i++)
            diff.push_back(make_pair(beam+i, intensity[aperture]));
          A[aperture][row].first = coord.second;
        } else {
          for (int i=0;i<(coord.second-A[aperture][row].second);i++)
            diff.push_back(make_pair(beam-(coord.second-A[aperture][row].second)+1+i, intensity[aperture]));
          A[aperture][row].second = coord.second;
        }
      }
		 	updateIntensity(diff);
		 //	printIntensity(true);
		}/* else {
		  cout << "Not active or not closed" << endl;
		} */
		last_diff=diff;
		return(diff);
  }